

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_task_impl.cpp
# Opt level: O0

MPP_RET mpp_task_queue_deinit(MppTaskQueue queue)

{
  undefined4 uVar1;
  MppMeta meta_00;
  long lVar2;
  Mutex *this;
  Condition *pCVar3;
  RK_S32 RVar4;
  __sighandler_t __handler;
  __sighandler_t __handler_00;
  int in_ESI;
  MppMeta meta;
  RK_S32 i;
  MppTaskQueueImpl *p;
  MppTaskQueue queue_local;
  
  if (queue == (MppTaskQueue)0x0) {
    _mpp_log_l(2,"mpp_task_impl","found NULL input queue\n","mpp_task_queue_deinit");
    queue_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    Mutex::lock(*(Mutex **)((long)queue + 0x28));
    *(undefined4 *)((long)queue + 0x34) = 0;
    Condition::signal(*(Condition **)((long)queue + 0x68),in_ESI,__handler);
    Condition::signal(*(Condition **)((long)queue + 0xa8),in_ESI,__handler_00);
    if (*(long *)((long)queue + 0x48) != 0) {
      for (meta._4_4_ = 0; (int)meta._4_4_ < *(int *)((long)queue + 0x30);
          meta._4_4_ = meta._4_4_ + 1) {
        meta_00 = *(MppMeta *)(*(long *)((long)queue + 0x48) + (long)(int)meta._4_4_ * 0x30 + 0x28);
        RVar4 = mpp_meta_size(meta_00);
        if (RVar4 != 0) {
          lVar2 = *(long *)((long)queue + 0x48);
          uVar1 = *(undefined4 *)
                   (*(long *)((long)queue + 0x48) + (long)(int)meta._4_4_ * 0x30 + 0x24);
          RVar4 = mpp_meta_size(meta_00);
          _mpp_log_l(2,"mpp_task_impl","%s queue idx %d task %p status %d meta size %d\n",
                     "mpp_task_queue_deinit",queue,(ulong)meta._4_4_,
                     lVar2 + (long)(int)meta._4_4_ * 0x30,uVar1,RVar4);
          mpp_meta_dump(meta_00);
        }
        mpp_meta_put(*(MppMeta *)
                      (*(long *)((long)queue + 0x48) + (long)(int)meta._4_4_ * 0x30 + 0x28));
      }
      mpp_osal_free("mpp_task_queue_deinit",*(void **)((long)queue + 0x48));
    }
    if (*(long *)((long)queue + 0x38) != 0) {
      mpp_port_deinit(*(MppPort *)((long)queue + 0x38));
      *(undefined8 *)((long)queue + 0x38) = 0;
    }
    if (*(long *)((long)queue + 0x40) != 0) {
      mpp_port_deinit(*(MppPort *)((long)queue + 0x40));
      *(undefined8 *)((long)queue + 0x40) = 0;
    }
    Mutex::unlock(*(Mutex **)((long)queue + 0x28));
    if ((*(long *)((long)queue + 0x28) != 0) &&
       (this = *(Mutex **)((long)queue + 0x28), this != (Mutex *)0x0)) {
      Mutex::~Mutex(this);
      operator_delete(this,0x28);
    }
    if (*(long *)((long)queue + 0x68) != 0) {
      pCVar3 = *(Condition **)((long)queue + 0x68);
      if (pCVar3 != (Condition *)0x0) {
        Condition::~Condition(pCVar3);
        operator_delete(pCVar3,0x30);
      }
      *(undefined8 *)((long)queue + 0x68) = 0;
    }
    if (*(long *)((long)queue + 0xa8) != 0) {
      pCVar3 = *(Condition **)((long)queue + 0xa8);
      if (pCVar3 != (Condition *)0x0) {
        Condition::~Condition(pCVar3);
        operator_delete(pCVar3,0x30);
      }
      *(undefined8 *)((long)queue + 0xa8) = 0;
    }
    mpp_osal_free("mpp_task_queue_deinit",queue);
    queue_local._4_4_ = MPP_OK;
  }
  return queue_local._4_4_;
}

Assistant:

MPP_RET mpp_task_queue_deinit(MppTaskQueue queue)
{
    if (NULL == queue) {
        mpp_err_f("found NULL input queue\n");
        return MPP_ERR_NULL_PTR;
    }

    MppTaskQueueImpl *p = (MppTaskQueueImpl *)queue;
    p->lock->lock();

    p->ready = 0;
    p->info[MPP_INPUT_PORT].cond->signal();
    p->info[MPP_OUTPUT_PORT].cond->signal();
    if (p->tasks) {
        for (RK_S32 i = 0; i < p->task_count; i++) {
            MppMeta meta = p->tasks[i].meta;

            /* we must ensure that all task return to init status */
            if (mpp_meta_size(meta)) {
                mpp_err_f("%s queue idx %d task %p status %d meta size %d\n",
                          p->name, i, &p->tasks[i], p->tasks[i].status,
                          mpp_meta_size(meta));
                mpp_meta_dump(meta);
            }
            mpp_meta_put(p->tasks[i].meta);
        }
        mpp_free(p->tasks);
    }

    if (p->input) {
        mpp_port_deinit(p->input);
        p->input = NULL;
    }
    if (p->output) {
        mpp_port_deinit(p->output);
        p->output = NULL;
    }
    p->lock->unlock();
    if (p->lock)
        delete p->lock;
    if (p->info[MPP_INPUT_PORT].cond) {
        delete p->info[MPP_INPUT_PORT].cond;
        p->info[MPP_INPUT_PORT].cond = NULL;
    }
    if (p->info[MPP_OUTPUT_PORT].cond) {
        delete p->info[MPP_OUTPUT_PORT].cond;
        p->info[MPP_OUTPUT_PORT].cond = NULL;
    }
    mpp_free(p);
    return MPP_OK;
}